

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

double GuessVerificationProgress(ChainTxData *data,CBlockIndex *pindex)

{
  ulong uVar1;
  time_t tVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  string_view logging_function;
  string_view source_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  dVar5 = 0.0;
  if (pindex != (CBlockIndex *)0x0) {
    if (pindex->m_chain_tx_count == 0) {
      FormatFullVersion_abi_cxx11_();
      logging_function._M_str = "GuessVerificationProgress";
      logging_function._M_len = 0x19;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<int,char[13],std::__cxx11::string,char[42]>
                (logging_function,source_file,0x15ba,ALL,Warning,(ConstevalFormatString<4U>)0x823bc5
                 ,&pindex->nHeight,(char (*) [13])"Bitcoin Core",&local_38,
                 (char (*) [42])"https://github.com/bitcoin/bitcoin/issues");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      dVar5 = 0.0;
    }
    else {
      tVar2 = time((time_t *)0x0);
      uVar1 = pindex->m_chain_tx_count;
      uVar4 = data->tx_count;
      if (uVar4 < uVar1) {
        uVar3 = (ulong)pindex->nTime;
        uVar4 = uVar1;
      }
      else {
        uVar3 = data->nTime;
      }
      auVar6._8_4_ = (int)(uVar4 >> 0x20);
      auVar6._0_8_ = uVar4;
      auVar6._12_4_ = 0x45300000;
      auVar8._8_4_ = (int)(uVar1 >> 0x20);
      auVar8._0_8_ = uVar1;
      auVar8._12_4_ = 0x45300000;
      dVar7 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
              ((double)(long)(tVar2 - uVar3) * data->dTxRate +
              (auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
      dVar5 = 1.0;
      if (dVar7 <= 1.0) {
        dVar5 = dVar7;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return dVar5;
  }
  __stack_chk_fail();
}

Assistant:

double GuessVerificationProgress(const ChainTxData& data, const CBlockIndex *pindex) {
    if (pindex == nullptr)
        return 0.0;

    if (!Assume(pindex->m_chain_tx_count > 0)) {
        LogWarning("Internal bug detected: block %d has unset m_chain_tx_count (%s %s). Please report this issue here: %s\n",
                   pindex->nHeight, PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
        return 0.0;
    }

    int64_t nNow = time(nullptr);

    double fTxTotal;

    if (pindex->m_chain_tx_count <= data.tx_count) {
        fTxTotal = data.tx_count + (nNow - data.nTime) * data.dTxRate;
    } else {
        fTxTotal = pindex->m_chain_tx_count + (nNow - pindex->GetBlockTime()) * data.dTxRate;
    }

    return std::min<double>(pindex->m_chain_tx_count / fTxTotal, 1.0);
}